

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerBailOnMissingValue(Lowerer *this,Instr *instr,RegOpnd *arrayOpnd)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *target;
  IndirOpnd *testSrc1;
  IntConstOpnd *testSrc2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48 [4];
  AutoReuseOpnd autoReuseArrayOpnd;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33ca,"(instr)","instr");
    if (!bVar2) goto LAB_0055f6e7;
    *puVar3 = 0;
  }
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cb,"(!instr->GetDst())","!instr->GetDst()");
    if (!bVar2) goto LAB_0055f6e7;
    *puVar3 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cc,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar2) goto LAB_0055f6e7;
    *puVar3 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cd,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) goto LAB_0055f6e7;
    *puVar3 = 0;
  }
  if (arrayOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33ce,"(arrayOpnd)","arrayOpnd");
    if (!bVar2) goto LAB_0055f6e7;
    *puVar3 = 0;
  }
  local_48[0] = (arrayOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_48[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cf,"(arrayOpnd->GetValueType().IsArrayOrObjectWithArray())",
                       "arrayOpnd->GetValueType().IsArrayOrObjectWithArray()");
    if (!bVar2) {
LAB_0055f6e7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = instr->m_func;
  target = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&local_48[0].field_0,&arrayOpnd->super_Opnd,func,true);
  testSrc1 = IR::IndirOpnd::New(arrayOpnd,0x18,TyUint8,func,false);
  testSrc2 = IR::IntConstOpnd::New(4,TyUint8,func,true);
  InsertTestBranch(&testSrc1->super_Opnd,&testSrc2->super_Opnd,BrNeq_A,target,instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&local_48[0].field_0);
  return;
}

Assistant:

void Lowerer::LowerBailOnMissingValue(IR::Instr *const instr, IR::RegOpnd *const arrayOpnd)
{
    Assert(instr);
    Assert(!instr->GetDst());
    Assert(!instr->GetSrc1());
    Assert(!instr->GetSrc2());
    Assert(arrayOpnd);
    Assert(arrayOpnd->GetValueType().IsArrayOrObjectWithArray());

    Func *const func = instr->m_func;

    // Label to jump to when not bailing out
    const auto skipBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr->InsertAfter(skipBailOutLabel);

    // Skip bail-out when the array has no missing values
    //
    // test [array + offsetOf(objectArrayOrFlags)], Js::DynamicObjectFlags::HasNoMissingValues
    // jnz  $skipBailOut
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, func);
    CompileAssert(
        static_cast<Js::DynamicObjectFlags>(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues)) ==
        Js::DynamicObjectFlags::HasNoMissingValues);
    InsertTestBranch(
        IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, func),
        IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, func, true),
        Js::OpCode::BrNeq_A,
        skipBailOutLabel,
        instr);

    // Generate the bailout helper call. 'instr' will be changed to the CALL into the bailout function, so it can't be used for
    // ordering instructions anymore.
    GenerateBailOut(instr);
}